

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QNetworkRequest::KnownHeaders,QVariant>::emplace<QVariant_const&>
          (QHash<QNetworkRequest::KnownHeaders,QVariant> *this,KnownHeaders *key,QVariant *args)

{
  PrivateShared *pPVar1;
  Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = *(PrivateShared **)this;
  if (pPVar1 == (PrivateShared *)0x0) {
LAB_001a1c46:
    pDVar2 = *(Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> **)this;
    local_48._0_8_ = pPVar1;
    if ((pDVar2 == (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)0x0) ||
       (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
      pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::
               detached(pDVar2);
      *(Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> **)this = pDVar2;
    }
    pVar3 = (piter)emplace_helper<QVariant_const&>(this,key,args);
    QHash<QNetworkRequest::KnownHeaders,_QVariant>::~QHash
              ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)&local_48.shared);
  }
  else {
    if (1 < *(uint *)pPVar1) {
      if ((pPVar1 != (PrivateShared *)0x0) && (*(uint *)pPVar1 != 0xffffffff)) {
        LOCK();
        *(uint *)pPVar1 = *(uint *)pPVar1 + 1;
        UNLOCK();
      }
      goto LAB_001a1c46;
    }
    if (*(ulong *)(pPVar1 + 8) < *(ulong *)(pPVar1 + 0x10) >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        pVar3 = (piter)emplace_helper<QVariant_const&>(this,key,args);
        return (iterator)pVar3;
      }
      goto LAB_001a1cc7;
    }
    QVariant::QVariant((QVariant *)&local_48,args);
    pVar3 = (piter)QHash<QNetworkRequest::KnownHeaders,_QVariant>::emplace_helper<QVariant>
                             ((QHash<QNetworkRequest::KnownHeaders,_QVariant> *)this,key,
                              (QVariant *)&local_48);
    QVariant::~QVariant((QVariant *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (iterator)pVar3;
  }
LAB_001a1cc7:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }